

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void testDeepScanLineBasic(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  int in_stack_00000028;
  int in_stack_0000002c;
  string *in_stack_00000030;
  exception *e;
  int numThreads;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_b6a8b::testCompressionTypeChecks();
  anon_unknown.dwarf_b6a8b::readWriteTest(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  anon_unknown.dwarf_b6a8b::readWriteTest(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  anon_unknown.dwarf_b6a8b::readWriteTest(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void testDeepScanLineBasic (const std::string &tempDir)
{
    try
    {
        cout << "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(4);

        
        testCompressionTypeChecks();
	
        readWriteTest (tempDir, 1, 100);
	    readWriteTest (tempDir, 3,  50);
        readWriteTest (tempDir,10,  10);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}